

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long uVar4;
  char *pcVar5;
  unsigned_long dindex;
  string next;
  Directory d;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  char *local_38;
  
  local_38 = prefix;
  bVar2 = AddFile(this,path,skip,prefix);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,path,&local_7a);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_78);
    bVar3 = true;
    if (bVar2 && recursive) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,path,&local_79);
      bVar3 = cmsys::SystemTools::FileIsSymlink(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar2 = true;
    if (bVar3 == false) {
      cmsys::Directory::Directory((Directory *)&local_58);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,path,&local_7a);
      bVar3 = cmsys::Directory::Load((Directory *)&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,path,&local_7a);
        std::__cxx11::string::append((char *)&local_78);
        sVar1 = local_78._M_string_length;
        uVar4 = cmsys::Directory::GetNumberOfFiles((Directory *)&local_58);
        if (uVar4 != 0) {
          dindex = 0;
          do {
            pcVar5 = cmsys::Directory::GetFile((Directory *)&local_58,dindex);
            if ((*pcVar5 != '.') ||
               ((pcVar5[1] != '\0' && ((pcVar5[1] != '.' || (pcVar5[2] != '\0')))))) {
              if (local_78._M_string_length < sVar1) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",sVar1);
              }
              local_78._M_dataplus._M_p[sVar1] = '\0';
              local_78._M_string_length = sVar1;
              std::__cxx11::string::append((char *)&local_78);
              bVar3 = AddPath(this,local_78._M_dataplus._M_p,skip,local_38,true);
              if (!bVar3) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                bVar2 = false;
                goto LAB_00173894;
              }
            }
            dindex = dindex + 1;
          } while (uVar4 != dindex);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00173894:
      cmsys::Directory::~Directory((Directory *)&local_58);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (!this->AddFile(path, skip, prefix)) {
    return false;
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = path;
    next += "/";
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}